

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf-test.cc
# Opt level: O2

void __thiscall PrintfTest_VPrintf_Test::TestBody(PrintfTest_VPrintf_Test *this)

{
  char (*format) [3];
  bool bVar1;
  AssertionResult *pAVar2;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>_2
  in_R8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>_2
  message;
  char *message_00;
  basic_format_args<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
  args;
  basic_format_args<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
  args_00;
  basic_format_args<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
  args_01;
  basic_format_args<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
  args_02;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_1;
  string gtest_expected_output;
  OutputRedirect gtest_redir;
  format_arg_store<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_int>
  as;
  
  format = fmt::v5::
           format_arg_store<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>>,int>
           ::TYPES;
  as.data_[0].field_0.long_long_value = 0x2a;
  args.field_1.values_ = in_R8.values_;
  args.types_ = (unsigned_long_long)&as;
  fmt::v5::vsprintf<char[3],char>
            (&gtest_expected_output,(v5 *)0x197e8f,
             fmt::v5::
             format_arg_store<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>>,int>
             ::TYPES,args);
  message.values_ =
       (value<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
        *)0x198bdf;
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[3]>
            ((internal *)&gtest_ar,"fmt::vsprintf(\"%d\", args)","\"42\"",&gtest_expected_output,
             (char (*) [3])0x198bdf);
  std::__cxx11::string::~string((string *)&gtest_expected_output);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_expected_output);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message.values_ =
           (value<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
            *)0x19eeb0;
    }
    else {
      message = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>_2
                 )((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x205,(char *)message.values_);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_1,(Message *)&gtest_expected_output);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_expected_output);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::AssertionSuccess();
  if (gtest_ar_1.success_ == true) {
    std::__cxx11::string::string((string *)&gtest_expected_output,"42",(allocator *)&gtest_ar);
    OutputRedirect::OutputRedirect(&gtest_redir,_stdout);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      args_02.field_1.values_ = as.data_;
      args_02.types_ = (unsigned_long_long)format;
      fmt::v5::vprintf<char[3],char>((char (*) [3])0x197e8f,args_02);
    }
    OutputRedirect::restore_and_read_abi_cxx11_((string *)&gtest_ar,&gtest_redir);
    bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &gtest_ar,&gtest_expected_output);
    if (bVar1) {
      pAVar2 = testing::AssertionResult::operator<<
                         (&gtest_ar_1,
                          (char (*) [53])"fmt::vprintf(\"%d\", args) produces different output.\n");
      pAVar2 = testing::AssertionResult::operator<<(pAVar2,(char (*) [11])0x19e7e5);
      pAVar2 = testing::AssertionResult::operator<<(pAVar2,&gtest_expected_output);
      pAVar2 = testing::AssertionResult::operator<<(pAVar2,(char (*) [2])0x19eeaf);
      pAVar2 = testing::AssertionResult::operator<<(pAVar2,(char (*) [11])0x19e7d9);
      testing::AssertionResult::operator<<
                (pAVar2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar);
      std::__cxx11::string::~string((string *)&gtest_ar);
      OutputRedirect::~OutputRedirect(&gtest_redir);
      std::__cxx11::string::~string((string *)&gtest_expected_output);
      goto LAB_00120387;
    }
    std::__cxx11::string::~string((string *)&gtest_ar);
    OutputRedirect::~OutputRedirect(&gtest_redir);
    std::__cxx11::string::~string((string *)&gtest_expected_output);
  }
  else {
LAB_00120387:
    testing::Message::Message((Message *)&gtest_expected_output);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message.values_ =
           (value<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
            *)0x19eeb0;
    }
    else {
      message = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>_2
                 )((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x206,(char *)message.values_);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar,(Message *)&gtest_expected_output);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_expected_output);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  testing::AssertionSuccess();
  if (gtest_ar_1.success_ == true) {
    std::__cxx11::string::string((string *)&gtest_expected_output,"42",(allocator *)&gtest_ar);
    OutputRedirect::OutputRedirect(&gtest_redir,_stdout);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      args_00.field_1.values_ = message.values_;
      args_00.types_ = (unsigned_long_long)&as;
      fmt::v5::vfprintf<char[3],char>((v5 *)_stdout,(FILE *)0x197e8f,format,args_00);
    }
    OutputRedirect::restore_and_read_abi_cxx11_((string *)&gtest_ar,&gtest_redir);
    bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &gtest_ar,&gtest_expected_output);
    if (bVar1) {
      pAVar2 = testing::AssertionResult::operator<<
                         (&gtest_ar_1,
                          (char (*) [62])
                          "fmt::vfprintf(stdout, \"%d\", args) produces different output.\n");
      pAVar2 = testing::AssertionResult::operator<<(pAVar2,(char (*) [11])0x19e7e5);
      pAVar2 = testing::AssertionResult::operator<<(pAVar2,&gtest_expected_output);
      pAVar2 = testing::AssertionResult::operator<<(pAVar2,(char (*) [2])0x19eeaf);
      pAVar2 = testing::AssertionResult::operator<<(pAVar2,(char (*) [11])0x19e7d9);
      testing::AssertionResult::operator<<
                (pAVar2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar);
      std::__cxx11::string::~string((string *)&gtest_ar);
      OutputRedirect::~OutputRedirect(&gtest_redir);
      std::__cxx11::string::~string((string *)&gtest_expected_output);
      goto LAB_001204f8;
    }
    std::__cxx11::string::~string((string *)&gtest_ar);
    OutputRedirect::~OutputRedirect(&gtest_redir);
    std::__cxx11::string::~string((string *)&gtest_expected_output);
  }
  else {
LAB_001204f8:
    testing::Message::Message((Message *)&gtest_expected_output);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message.values_ =
           (value<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
            *)0x19eeb0;
    }
    else {
      message = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>_2
                 )((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x207,(char *)message.values_);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar,(Message *)&gtest_expected_output);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_expected_output);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  testing::AssertionSuccess();
  if (gtest_ar_1.success_ == true) {
    std::__cxx11::string::string((string *)&gtest_expected_output,"42",(allocator *)&gtest_ar);
    OutputRedirect::OutputRedirect(&gtest_redir,_stdout);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      args_01.field_1.values_ = message.values_;
      args_01.types_ = (unsigned_long_long)&as;
      fmt::v5::vfprintf<char[3],char>
                ((v5 *)&std::cout,(basic_ostream<char,_std::char_traits<char>_> *)0x197e8f,format,
                 args_01);
    }
    OutputRedirect::restore_and_read_abi_cxx11_((string *)&gtest_ar,&gtest_redir);
    bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &gtest_ar,&gtest_expected_output);
    if (!bVar1) {
      std::__cxx11::string::~string((string *)&gtest_ar);
      OutputRedirect::~OutputRedirect(&gtest_redir);
      std::__cxx11::string::~string((string *)&gtest_expected_output);
      goto LAB_001206e1;
    }
    pAVar2 = testing::AssertionResult::operator<<
                       (&gtest_ar_1,
                        (char (*) [65])
                        "fmt::vfprintf(std::cout, \"%d\", args) produces different output.\n");
    pAVar2 = testing::AssertionResult::operator<<(pAVar2,(char (*) [11])0x19e7e5);
    pAVar2 = testing::AssertionResult::operator<<(pAVar2,&gtest_expected_output);
    pAVar2 = testing::AssertionResult::operator<<(pAVar2,(char (*) [2])0x19eeaf);
    pAVar2 = testing::AssertionResult::operator<<(pAVar2,(char (*) [11])0x19e7d9);
    testing::AssertionResult::operator<<
              (pAVar2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar
              );
    std::__cxx11::string::~string((string *)&gtest_ar);
    OutputRedirect::~OutputRedirect(&gtest_redir);
    std::__cxx11::string::~string((string *)&gtest_expected_output);
  }
  testing::Message::Message((Message *)&gtest_expected_output);
  if (gtest_ar_1.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    message_00 = "";
  }
  else {
    message_00 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&gtest_ar,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
             ,0x208,message_00);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)&gtest_ar,(Message *)&gtest_expected_output);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_output);
LAB_001206e1:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  return;
}

Assistant:

TEST(PrintfTest, VPrintf) {
  fmt::format_arg_store<fmt::printf_context, int> as{42};
  fmt::basic_format_args<fmt::printf_context> args(as);
  EXPECT_EQ(fmt::vsprintf("%d", args), "42");
  EXPECT_WRITE(stdout, fmt::vprintf("%d", args), "42");
  EXPECT_WRITE(stdout, fmt::vfprintf(stdout, "%d", args), "42");
  EXPECT_WRITE(stdout, fmt::vfprintf(std::cout, "%d", args), "42");
}